

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

uint __thiscall
IRBuilder::ResolveVirtualLongBranch(IRBuilder *this,BranchInstr *branchInstr,uint offset)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Instr *instr;
  uint32 branchInstrByteCodeOffset;
  Instr *returnIPInstr;
  uint32 targetOffset;
  uint offset_local;
  BranchInstr *branchInstr_local;
  IRBuilder *this_local;
  
  returnIPInstr._4_4_ = offset;
  _targetOffset = branchInstr;
  branchInstr_local = (BranchInstr *)this;
  if (this->longBranchMap == (LongBranchMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1c69,"(longBranchMap)","longBranchMap");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (this->longBranchMap,(uint *)((long)&returnIPInstr + 4),(uint *)&returnIPInstr);
  if (bVar2) {
    bVar2 = IsLoopBodyOuterOffset(this,(uint)returnIPInstr);
    if (bVar2) {
      if ((_targetOffset->super_Instr).m_opcode == MultiBr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1c79,"(branchInstr->m_opcode != Js::OpCode::MultiBr)",
                           "branchInstr->m_opcode != Js::OpCode::MultiBr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = IsLoopBodyReturnIPInstr(this,(_targetOffset->super_Instr).m_prev);
      if (!bVar2) {
        uVar3 = IR::Instr::GetByteCodeOffset(&_targetOffset->super_Instr);
        instr = CreateLoopBodyReturnIPInstr(this,(uint)returnIPInstr,uVar3);
        uVar3 = IR::Instr::GetByteCodeOffset(&_targetOffset->super_Instr);
        if (((BranchInstr *)this->m_offsetToInstruction[uVar3] != _targetOffset) &&
           ((bVar2 = IR::Instr::HasBailOutInfo(this->m_offsetToInstruction[uVar3]), !bVar2 ||
            (BVar4 = IR::Instr::GetBailOutKind(this->m_offsetToInstruction[uVar3]),
            BVar4 != BailOutInjected)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c84,
                             "(this->m_offsetToInstruction[branchInstrByteCodeOffset] == branchInstr || (this->m_offsetToInstruction[branchInstrByteCodeOffset]->HasBailOutInfo() && this->m_offsetToInstruction[branchInstrByteCodeOffset]->GetBailOutKind() == IR::BailOutInjected))"
                             ,
                             "this->m_offsetToInstruction[branchInstrByteCodeOffset] == branchInstr || (this->m_offsetToInstruction[branchInstrByteCodeOffset]->HasBailOutInfo() && this->m_offsetToInstruction[branchInstrByteCodeOffset]->GetBailOutKind() == IR::BailOutInjected)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        InsertInstr(this,instr,&_targetOffset->super_Instr);
      }
      this_local._4_4_ = GetLoopBodyExitInstrOffset(this);
    }
    else {
      this_local._4_4_ = (uint)returnIPInstr;
    }
    return this_local._4_4_;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x1c6e,"(false)","false");
  if (bVar2) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

uint
IRBuilder::ResolveVirtualLongBranch(IR::BranchInstr * branchInstr, uint offset)
{
    Assert(longBranchMap);
    uint32 targetOffset;
    if (!longBranchMap->TryGetValue(offset, &targetOffset))
    {
        // If we see a VirtualLongBranchInstr, we must have a mapping to the real target offset
        Assert(false);
        Fatal();
    }

    //  If this is a jump out of the loop body we need to load the return IP and jump to the loop exit instead
    if (!IsLoopBodyOuterOffset(targetOffset))
    {
        return targetOffset;
    }

    // Multi branch shouldn't be exiting a loop
    Assert(branchInstr->m_opcode != Js::OpCode::MultiBr);

    // Don't load the return IP if it is already loaded (for the case of early exit)
    if (!IsLoopBodyReturnIPInstr(branchInstr->m_prev))
    {
        IR::Instr * returnIPInstr = CreateLoopBodyReturnIPInstr(targetOffset, branchInstr->GetByteCodeOffset());

        // Any jump to this branch to jump to the return IP load instr first
        uint32 branchInstrByteCodeOffset = branchInstr->GetByteCodeOffset();
        Assert(this->m_offsetToInstruction[branchInstrByteCodeOffset] == branchInstr ||
            (this->m_offsetToInstruction[branchInstrByteCodeOffset]->HasBailOutInfo() &&
            this->m_offsetToInstruction[branchInstrByteCodeOffset]->GetBailOutKind() == IR::BailOutInjected));

        InsertInstr(returnIPInstr, branchInstr);
    }
    return GetLoopBodyExitInstrOffset();
}